

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

void StoreCommands(MemoryManager *m,uint8_t *literals,size_t num_literals,uint32_t *commands,
                  size_t num_commands,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  uint8_t uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  uint8_t cmd_depths [128];
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  uint16_t local_10f8 [64];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  uint8_t local_ff8 [8];
  uint8_t auStack_ff0 [56];
  undefined8 local_fb8 [8];
  uint8_t local_f78 [64];
  uint8_t local_f38 [64];
  uint8_t auStack_ef8 [128];
  uint8_t local_e78 [64];
  uint8_t auStack_e38 [256];
  uint32_t local_d38;
  undefined8 local_d34;
  uint32_t local_c38 [20];
  int local_be8;
  uint8_t lit_depths [256];
  uint16_t lit_bits [256];
  uint32_t lit_histo [256];
  HuffmanTree tree [129];
  ulong uVar8;
  
  memset(lit_histo,0,0x400);
  cmd_depths[0x70] = '\0';
  cmd_depths[0x71] = '\0';
  cmd_depths[0x72] = '\0';
  cmd_depths[0x73] = '\0';
  cmd_depths[0x74] = '\0';
  cmd_depths[0x75] = '\0';
  cmd_depths[0x76] = '\0';
  cmd_depths[0x77] = '\0';
  cmd_depths[0x78] = '\0';
  cmd_depths[0x79] = '\0';
  cmd_depths[0x7a] = '\0';
  cmd_depths[0x7b] = '\0';
  cmd_depths[0x7c] = '\0';
  cmd_depths[0x7d] = '\0';
  cmd_depths[0x7e] = '\0';
  cmd_depths[0x7f] = '\0';
  cmd_depths[0x60] = '\0';
  cmd_depths[0x61] = '\0';
  cmd_depths[0x62] = '\0';
  cmd_depths[99] = '\0';
  cmd_depths[100] = '\0';
  cmd_depths[0x65] = '\0';
  cmd_depths[0x66] = '\0';
  cmd_depths[0x67] = '\0';
  cmd_depths[0x68] = '\0';
  cmd_depths[0x69] = '\0';
  cmd_depths[0x6a] = '\0';
  cmd_depths[0x6b] = '\0';
  cmd_depths[0x6c] = '\0';
  cmd_depths[0x6d] = '\0';
  cmd_depths[0x6e] = '\0';
  cmd_depths[0x6f] = '\0';
  cmd_depths[0x50] = '\0';
  cmd_depths[0x51] = '\0';
  cmd_depths[0x52] = '\0';
  cmd_depths[0x53] = '\0';
  cmd_depths[0x54] = '\0';
  cmd_depths[0x55] = '\0';
  cmd_depths[0x56] = '\0';
  cmd_depths[0x57] = '\0';
  cmd_depths[0x58] = '\0';
  cmd_depths[0x59] = '\0';
  cmd_depths[0x5a] = '\0';
  cmd_depths[0x5b] = '\0';
  cmd_depths[0x5c] = '\0';
  cmd_depths[0x5d] = '\0';
  cmd_depths[0x5e] = '\0';
  cmd_depths[0x5f] = '\0';
  cmd_depths[0x40] = '\0';
  cmd_depths[0x41] = '\0';
  cmd_depths[0x42] = '\0';
  cmd_depths[0x43] = '\0';
  cmd_depths[0x44] = '\0';
  cmd_depths[0x45] = '\0';
  cmd_depths[0x46] = '\0';
  cmd_depths[0x47] = '\0';
  cmd_depths[0x48] = '\0';
  cmd_depths[0x49] = '\0';
  cmd_depths[0x4a] = '\0';
  cmd_depths[0x4b] = '\0';
  cmd_depths[0x4c] = '\0';
  cmd_depths[0x4d] = '\0';
  cmd_depths[0x4e] = '\0';
  cmd_depths[0x4f] = '\0';
  cmd_depths[0x30] = '\0';
  cmd_depths[0x31] = '\0';
  cmd_depths[0x32] = '\0';
  cmd_depths[0x33] = '\0';
  cmd_depths[0x34] = '\0';
  cmd_depths[0x35] = '\0';
  cmd_depths[0x36] = '\0';
  cmd_depths[0x37] = '\0';
  cmd_depths[0x38] = '\0';
  cmd_depths[0x39] = '\0';
  cmd_depths[0x3a] = '\0';
  cmd_depths[0x3b] = '\0';
  cmd_depths[0x3c] = '\0';
  cmd_depths[0x3d] = '\0';
  cmd_depths[0x3e] = '\0';
  cmd_depths[0x3f] = '\0';
  cmd_depths[0x20] = '\0';
  cmd_depths[0x21] = '\0';
  cmd_depths[0x22] = '\0';
  cmd_depths[0x23] = '\0';
  cmd_depths[0x24] = '\0';
  cmd_depths[0x25] = '\0';
  cmd_depths[0x26] = '\0';
  cmd_depths[0x27] = '\0';
  cmd_depths[0x28] = '\0';
  cmd_depths[0x29] = '\0';
  cmd_depths[0x2a] = '\0';
  cmd_depths[0x2b] = '\0';
  cmd_depths[0x2c] = '\0';
  cmd_depths[0x2d] = '\0';
  cmd_depths[0x2e] = '\0';
  cmd_depths[0x2f] = '\0';
  cmd_depths[0x10] = '\0';
  cmd_depths[0x11] = '\0';
  cmd_depths[0x12] = '\0';
  cmd_depths[0x13] = '\0';
  cmd_depths[0x14] = '\0';
  cmd_depths[0x15] = '\0';
  cmd_depths[0x16] = '\0';
  cmd_depths[0x17] = '\0';
  cmd_depths[0x18] = '\0';
  cmd_depths[0x19] = '\0';
  cmd_depths[0x1a] = '\0';
  cmd_depths[0x1b] = '\0';
  cmd_depths[0x1c] = '\0';
  cmd_depths[0x1d] = '\0';
  cmd_depths[0x1e] = '\0';
  cmd_depths[0x1f] = '\0';
  cmd_depths[0] = '\0';
  cmd_depths[1] = '\0';
  cmd_depths[2] = '\0';
  cmd_depths[3] = '\0';
  cmd_depths[4] = '\0';
  cmd_depths[5] = '\0';
  cmd_depths[6] = '\0';
  cmd_depths[7] = '\0';
  cmd_depths[8] = '\0';
  cmd_depths[9] = '\0';
  cmd_depths[10] = '\0';
  cmd_depths[0xb] = '\0';
  cmd_depths[0xc] = '\0';
  cmd_depths[0xd] = '\0';
  cmd_depths[0xe] = '\0';
  cmd_depths[0xf] = '\0';
  local_10f8[0x38] = 0;
  local_10f8[0x39] = 0;
  local_10f8[0x3a] = 0;
  local_10f8[0x3b] = 0;
  local_10f8[0x3c] = 0;
  local_10f8[0x3d] = 0;
  local_10f8[0x3e] = 0;
  local_10f8[0x3f] = 0;
  local_10f8[0x30] = 0;
  local_10f8[0x31] = 0;
  local_10f8[0x32] = 0;
  local_10f8[0x33] = 0;
  local_10f8[0x34] = 0;
  local_10f8[0x35] = 0;
  local_10f8[0x36] = 0;
  local_10f8[0x37] = 0;
  local_10f8[0x28] = 0;
  local_10f8[0x29] = 0;
  local_10f8[0x2a] = 0;
  local_10f8[0x2b] = 0;
  local_10f8[0x2c] = 0;
  local_10f8[0x2d] = 0;
  local_10f8[0x2e] = 0;
  local_10f8[0x2f] = 0;
  local_10f8[0x20] = 0;
  local_10f8[0x21] = 0;
  local_10f8[0x22] = 0;
  local_10f8[0x23] = 0;
  local_10f8[0x24] = 0;
  local_10f8[0x25] = 0;
  local_10f8[0x26] = 0;
  local_10f8[0x27] = 0;
  local_10f8[0x18] = 0;
  local_10f8[0x19] = 0;
  local_10f8[0x1a] = 0;
  local_10f8[0x1b] = 0;
  local_10f8[0x1c] = 0;
  local_10f8[0x1d] = 0;
  local_10f8[0x1e] = 0;
  local_10f8[0x1f] = 0;
  local_10f8[0x10] = 0;
  local_10f8[0x11] = 0;
  local_10f8[0x12] = 0;
  local_10f8[0x13] = 0;
  local_10f8[0x14] = 0;
  local_10f8[0x15] = 0;
  local_10f8[0x16] = 0;
  local_10f8[0x17] = 0;
  local_10f8[8] = 0;
  local_10f8[9] = 0;
  local_10f8[10] = 0;
  local_10f8[0xb] = 0;
  local_10f8[0xc] = 0;
  local_10f8[0xd] = 0;
  local_10f8[0xe] = 0;
  local_10f8[0xf] = 0;
  local_10f8[0] = 0;
  local_10f8[1] = 0;
  local_10f8[2] = 0;
  local_10f8[3] = 0;
  local_10f8[4] = 0;
  local_10f8[5] = 0;
  local_10f8[6] = 0;
  local_10f8[7] = 0;
  memset(&local_d38,0,0x200);
  for (sVar10 = 0; num_literals != sVar10; sVar10 = sVar10 + 1) {
    lit_histo[literals[sVar10]] = lit_histo[literals[sVar10]] + 1;
  }
  BrotliBuildAndStoreHuffmanTreeFast
            (m,lit_histo,num_literals,8,lit_depths,lit_bits,storage_ix,storage);
  for (sVar10 = 0; num_commands != sVar10; sVar10 = sVar10 + 1) {
    (&local_d38)[(byte)commands[sVar10]] = (&local_d38)[(byte)commands[sVar10]] + 1;
  }
  local_d34 = CONCAT44((int)((ulong)local_d34 >> 0x20) + 1,(int)local_d34 + 1);
  local_c38[0] = local_c38[0] + 1;
  local_be8 = local_be8 + 1;
  memset(local_fb8,0,0x280);
  BrotliCreateHuffmanTree(&local_d38,0x40,0xf,tree,cmd_depths);
  depth = cmd_depths + 0x40;
  BrotliCreateHuffmanTree(local_c38,0x40,0xe,tree,depth);
  auStack_ff0[8] = cmd_depths[0x28];
  auStack_ff0[9] = cmd_depths[0x29];
  auStack_ff0[10] = cmd_depths[0x2a];
  auStack_ff0[0xb] = cmd_depths[0x2b];
  auStack_ff0[0xc] = cmd_depths[0x2c];
  auStack_ff0[0xd] = cmd_depths[0x2d];
  auStack_ff0[0xe] = cmd_depths[0x2e];
  auStack_ff0[0xf] = cmd_depths[0x2f];
  local_ff8[0] = cmd_depths[0x18];
  local_ff8[1] = cmd_depths[0x19];
  local_ff8[2] = cmd_depths[0x1a];
  local_ff8[3] = cmd_depths[0x1b];
  local_ff8[4] = cmd_depths[0x1c];
  local_ff8[5] = cmd_depths[0x1d];
  local_ff8[6] = cmd_depths[0x1e];
  local_ff8[7] = cmd_depths[0x1f];
  auStack_ff0[0] = cmd_depths[0x20];
  auStack_ff0[1] = cmd_depths[0x21];
  auStack_ff0[2] = cmd_depths[0x22];
  auStack_ff0[3] = cmd_depths[0x23];
  auStack_ff0[4] = cmd_depths[0x24];
  auStack_ff0[5] = cmd_depths[0x25];
  auStack_ff0[6] = cmd_depths[0x26];
  auStack_ff0[7] = cmd_depths[0x27];
  auStack_ff0[0x10] = cmd_depths[0];
  auStack_ff0[0x11] = cmd_depths[1];
  auStack_ff0[0x12] = cmd_depths[2];
  auStack_ff0[0x13] = cmd_depths[3];
  auStack_ff0[0x14] = cmd_depths[4];
  auStack_ff0[0x15] = cmd_depths[5];
  auStack_ff0[0x16] = cmd_depths[6];
  auStack_ff0[0x17] = cmd_depths[7];
  auStack_ff0[0x18] = cmd_depths[0x30];
  auStack_ff0[0x19] = cmd_depths[0x31];
  auStack_ff0[0x1a] = cmd_depths[0x32];
  auStack_ff0[0x1b] = cmd_depths[0x33];
  auStack_ff0[0x1c] = cmd_depths[0x34];
  auStack_ff0[0x1d] = cmd_depths[0x35];
  auStack_ff0[0x1e] = cmd_depths[0x36];
  auStack_ff0[0x1f] = cmd_depths[0x37];
  auStack_ff0[0x20] = cmd_depths[8];
  auStack_ff0[0x21] = cmd_depths[9];
  auStack_ff0[0x22] = cmd_depths[10];
  auStack_ff0[0x23] = cmd_depths[0xb];
  auStack_ff0[0x24] = cmd_depths[0xc];
  auStack_ff0[0x25] = cmd_depths[0xd];
  auStack_ff0[0x26] = cmd_depths[0xe];
  auStack_ff0[0x27] = cmd_depths[0xf];
  auStack_ff0[0x28] = cmd_depths[0x38];
  auStack_ff0[0x29] = cmd_depths[0x39];
  auStack_ff0[0x2a] = cmd_depths[0x3a];
  auStack_ff0[0x2b] = cmd_depths[0x3b];
  auStack_ff0[0x2c] = cmd_depths[0x3c];
  auStack_ff0[0x2d] = cmd_depths[0x3d];
  auStack_ff0[0x2e] = cmd_depths[0x3e];
  auStack_ff0[0x2f] = cmd_depths[0x3f];
  auStack_ff0[0x30] = cmd_depths[0x10];
  auStack_ff0[0x31] = cmd_depths[0x11];
  auStack_ff0[0x32] = cmd_depths[0x12];
  auStack_ff0[0x33] = cmd_depths[0x13];
  auStack_ff0[0x34] = cmd_depths[0x14];
  auStack_ff0[0x35] = cmd_depths[0x15];
  auStack_ff0[0x36] = cmd_depths[0x16];
  auStack_ff0[0x37] = cmd_depths[0x17];
  BrotliConvertBitDepthsToSymbols(local_ff8,0x40,(uint16_t *)&local_1078);
  local_1178 = local_1048;
  uStack_1170 = uStack_1040;
  local_1168 = local_1028;
  uStack_1160 = uStack_1020;
  local_1158 = local_1008;
  uStack_1150 = uStack_1000;
  local_1148 = local_1078;
  uStack_1140 = uStack_1070;
  local_1138 = local_1068;
  uStack_1130 = uStack_1060;
  local_1128 = local_1058;
  uStack_1120 = uStack_1050;
  local_1118 = local_1038;
  uStack_1110 = uStack_1030;
  local_1108 = local_1018;
  uStack_1100 = uStack_1010;
  BrotliConvertBitDepthsToSymbols(depth,0x40,local_10f8);
  auStack_ff0[0] = '\0';
  auStack_ff0[1] = '\0';
  auStack_ff0[2] = '\0';
  auStack_ff0[3] = '\0';
  auStack_ff0[4] = '\0';
  auStack_ff0[5] = '\0';
  auStack_ff0[6] = '\0';
  auStack_ff0[7] = '\0';
  auStack_ff0[0x28] = '\0';
  auStack_ff0[0x29] = '\0';
  auStack_ff0[0x2a] = '\0';
  auStack_ff0[0x2b] = '\0';
  auStack_ff0[0x2c] = '\0';
  auStack_ff0[0x2d] = '\0';
  auStack_ff0[0x2e] = '\0';
  auStack_ff0[0x2f] = '\0';
  auStack_ff0[0x30] = '\0';
  auStack_ff0[0x31] = '\0';
  auStack_ff0[0x32] = '\0';
  auStack_ff0[0x33] = '\0';
  auStack_ff0[0x34] = '\0';
  auStack_ff0[0x35] = '\0';
  auStack_ff0[0x36] = '\0';
  auStack_ff0[0x37] = '\0';
  auStack_ff0[0x18] = '\0';
  auStack_ff0[0x19] = '\0';
  auStack_ff0[0x1a] = '\0';
  auStack_ff0[0x1b] = '\0';
  auStack_ff0[0x1c] = '\0';
  auStack_ff0[0x1d] = '\0';
  auStack_ff0[0x1e] = '\0';
  auStack_ff0[0x1f] = '\0';
  auStack_ff0[0x20] = '\0';
  auStack_ff0[0x21] = '\0';
  auStack_ff0[0x22] = '\0';
  auStack_ff0[0x23] = '\0';
  auStack_ff0[0x24] = '\0';
  auStack_ff0[0x25] = '\0';
  auStack_ff0[0x26] = '\0';
  auStack_ff0[0x27] = '\0';
  auStack_ff0[8] = '\0';
  auStack_ff0[9] = '\0';
  auStack_ff0[10] = '\0';
  auStack_ff0[0xb] = '\0';
  auStack_ff0[0xc] = '\0';
  auStack_ff0[0xd] = '\0';
  auStack_ff0[0xe] = '\0';
  auStack_ff0[0xf] = '\0';
  auStack_ff0[0x10] = '\0';
  auStack_ff0[0x11] = '\0';
  auStack_ff0[0x12] = '\0';
  auStack_ff0[0x13] = '\0';
  auStack_ff0[0x14] = '\0';
  auStack_ff0[0x15] = '\0';
  auStack_ff0[0x16] = '\0';
  auStack_ff0[0x17] = '\0';
  local_ff8[0] = cmd_depths[0x18];
  local_ff8[1] = cmd_depths[0x19];
  local_ff8[2] = cmd_depths[0x1a];
  local_ff8[3] = cmd_depths[0x1b];
  local_ff8[4] = cmd_depths[0x1c];
  local_ff8[5] = cmd_depths[0x1d];
  local_ff8[6] = cmd_depths[0x1e];
  local_ff8[7] = cmd_depths[0x1f];
  local_fb8[0]._0_1_ = cmd_depths[0x20];
  local_fb8[0]._1_1_ = cmd_depths[0x21];
  local_fb8[0]._2_1_ = cmd_depths[0x22];
  local_fb8[0]._3_1_ = cmd_depths[0x23];
  local_fb8[0]._4_1_ = cmd_depths[0x24];
  local_fb8[0]._5_1_ = cmd_depths[0x25];
  local_fb8[0]._6_1_ = cmd_depths[0x26];
  local_fb8[0]._7_1_ = cmd_depths[0x27];
  local_f78[0] = cmd_depths[0x28];
  local_f78[1] = cmd_depths[0x29];
  local_f78[2] = cmd_depths[0x2a];
  local_f78[3] = cmd_depths[0x2b];
  local_f78[4] = cmd_depths[0x2c];
  local_f78[5] = cmd_depths[0x2d];
  local_f78[6] = cmd_depths[0x2e];
  local_f78[7] = cmd_depths[0x2f];
  local_f38[0] = cmd_depths[0x30];
  local_f38[1] = cmd_depths[0x31];
  local_f38[2] = cmd_depths[0x32];
  local_f38[3] = cmd_depths[0x33];
  local_f38[4] = cmd_depths[0x34];
  local_f38[5] = cmd_depths[0x35];
  local_f38[6] = cmd_depths[0x36];
  local_f38[7] = cmd_depths[0x37];
  local_e78[0] = cmd_depths[0x38];
  local_e78[1] = cmd_depths[0x39];
  local_e78[2] = cmd_depths[0x3a];
  local_e78[3] = cmd_depths[0x3b];
  local_e78[4] = cmd_depths[0x3c];
  local_e78[5] = cmd_depths[0x3d];
  local_e78[6] = cmd_depths[0x3e];
  local_e78[7] = cmd_depths[0x3f];
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    uVar1 = cmd_depths[lVar3 + 8];
    local_f78[lVar3 * 8] = cmd_depths[lVar3];
    auStack_ef8[lVar3 * 8] = uVar1;
    auStack_e38[lVar3 * 8] = cmd_depths[lVar3 + 0x10];
  }
  BrotliStoreHuffmanTree(local_ff8,0x2c0,tree,storage_ix,storage);
  BrotliStoreHuffmanTree(depth,0x40,tree,storage_ix,storage);
  for (sVar10 = 0; sVar10 != num_commands; sVar10 = sVar10 + 1) {
    uVar7 = commands[sVar10] & 0xff;
    uVar8 = (ulong)uVar7;
    uVar4 = commands[sVar10] >> 8;
    uVar6 = *storage_ix;
    uVar9 = cmd_depths[uVar8] + uVar6;
    *(ulong *)(storage + (uVar6 >> 3)) =
         (ulong)*(ushort *)((long)&local_1178 + uVar8 * 2) << ((byte)uVar6 & 7) |
         (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar9;
    uVar6 = StoreCommands::kNumExtraBits[uVar8] + uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)uVar4 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar6;
    if (uVar7 < 0x18) {
      iVar5 = uVar4 + StoreCommands::kInsertOffset[uVar8];
      while (bVar11 = iVar5 != 0, iVar5 = iVar5 + -1, bVar11) {
        bVar2 = lit_depths[*literals];
        *(ulong *)(storage + (uVar6 >> 3)) =
             (ulong)lit_bits[*literals] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
        uVar6 = uVar6 + bVar2;
        *storage_ix = uVar6;
        literals = literals + 1;
      }
    }
  }
  return;
}

Assistant:

static void StoreCommands(MemoryManager* m,
                          const uint8_t* literals, const size_t num_literals,
                          const uint32_t* commands, const size_t num_commands,
                          size_t* storage_ix, uint8_t* storage) {
  static const uint32_t kNumExtraBits[128] = {
    0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 12, 14, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4,
    0, 0, 0, 0, 0, 0, 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 7, 8, 9, 10, 24,
    0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
    1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8,
    9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
    17, 17, 18, 18, 19, 19, 20, 20, 21, 21, 22, 22, 23, 23, 24, 24,
  };
  static const uint32_t kInsertOffset[24] = {
    0, 1, 2, 3, 4, 5, 6, 8, 10, 14, 18, 26, 34, 50, 66, 98, 130, 194, 322, 578,
    1090, 2114, 6210, 22594,
  };

  uint8_t lit_depths[256];
  uint16_t lit_bits[256];
  uint32_t lit_histo[256] = { 0 };
  uint8_t cmd_depths[128] = { 0 };
  uint16_t cmd_bits[128] = { 0 };
  uint32_t cmd_histo[128] = { 0 };
  size_t i;
  for (i = 0; i < num_literals; ++i) {
    ++lit_histo[literals[i]];
  }
  BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo, num_literals,
                                     /* max_bits = */ 8,
                                     lit_depths, lit_bits,
                                     storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;

  for (i = 0; i < num_commands; ++i) {
    const uint32_t code = commands[i] & 0xFF;
    BROTLI_DCHECK(code < 128);
    ++cmd_histo[code];
  }
  cmd_histo[1] += 1;
  cmd_histo[2] += 1;
  cmd_histo[64] += 1;
  cmd_histo[84] += 1;
  BuildAndStoreCommandPrefixCode(cmd_histo, cmd_depths, cmd_bits,
                                 storage_ix, storage);

  for (i = 0; i < num_commands; ++i) {
    const uint32_t cmd = commands[i];
    const uint32_t code = cmd & 0xFF;
    const uint32_t extra = cmd >> 8;
    BROTLI_DCHECK(code < 128);
    BrotliWriteBits(cmd_depths[code], cmd_bits[code], storage_ix, storage);
    BrotliWriteBits(kNumExtraBits[code], extra, storage_ix, storage);
    if (code < 24) {
      const uint32_t insert = kInsertOffset[code] + extra;
      uint32_t j;
      for (j = 0; j < insert; ++j) {
        const uint8_t lit = *literals;
        BrotliWriteBits(lit_depths[lit], lit_bits[lit], storage_ix, storage);
        ++literals;
      }
    }
  }
}